

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokNextMethod(sqlite3_vtab_cursor *pCursor)

{
  int local_24;
  int rc;
  Fts3tokTable *pTab;
  Fts3tokCursor *pCsr;
  sqlite3_vtab_cursor *pCursor_local;
  
  *(int *)&pCursor[3].pVtab = *(int *)&pCursor[3].pVtab + 1;
  local_24 = (*(pCursor->pVtab[1].pModule)->xDestroy)(pCursor[2].pVtab);
  if ((local_24 != 0) && (fts3tokResetCursor((Fts3tokCursor *)pCursor), local_24 == 0x65)) {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static int fts3tokNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts3tokCursor *pCsr = (Fts3tokCursor *)pCursor;
  Fts3tokTable *pTab = (Fts3tokTable *)(pCursor->pVtab);
  int rc;                         /* Return code */

  pCsr->iRowid++;
  rc = pTab->pMod->xNext(pCsr->pCsr,
      &pCsr->zToken, &pCsr->nToken,
      &pCsr->iStart, &pCsr->iEnd, &pCsr->iPos
  );

  if( rc!=SQLITE_OK ){
    fts3tokResetCursor(pCsr);
    if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  }

  return rc;
}